

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.c
# Opt level: O1

char * read_all(FILE *source)

{
  size_t __size;
  char *__ptr;
  
  fseek((FILE *)source,0,2);
  __size = ftell((FILE *)source);
  fseek((FILE *)source,0,0);
  __ptr = (char *)malloc(__size + 1);
  fread(__ptr,__size,1,(FILE *)source);
  fclose((FILE *)source);
  __ptr[__size] = '\0';
  return __ptr;
}

Assistant:

char* read_all(FILE* source){ 
    fseek(source, 0, SEEK_END);
    long fsize = ftell(source);
    fseek(source, 0, SEEK_SET);

    char *string = (char *)mallocate(fsize + 1);
    fread(string, fsize, 1, source);
    fclose(source);

    string[fsize] = 0;

    return string;
}